

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O0

void decode_nvrm_mthd_context_enable_device(nvrm_mthd_context_enable_device *m)

{
  int iVar1;
  uint local_14;
  int j;
  nvrm_mthd_context_enable_device *m_local;
  
  if ((m->gpu_id != 0) || (iVar1 = _nvrm_field_enabled("gpu_id"), iVar1 != 0)) {
    fprintf(_stdout,"%sgpu_id: 0x%08x",nvrm_pfx,(ulong)m->gpu_id);
  }
  nvrm_pfx = nvrm_sep;
  for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
    if (m->unk04[(int)local_14] != 0) {
      fprintf(_stdout,", unk04[%d]: 0x%08x ",(ulong)local_14,(ulong)m->unk04[(int)local_14]);
    }
  }
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_context_enable_device(struct nvrm_mthd_context_enable_device *m)
{
	int j;
	nvrm_print_x32(m, gpu_id);
	for (j = 0; j < 32; ++j)
		if (m->unk04[j] != 0)
			mmt_log_cont(", unk04[%d]: 0x%08x ", j, m->unk04[j]);
	nvrm_print_ln();
}